

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O0

void stlez_(double *y,int *n,int *np,int *ns,int *isdeg,int *itdeg,int *robust,int *no,double *rw,
           double *season,double *trend,double *work)

{
  int iVar1;
  int local_f4 [2];
  int c_true;
  int c_false;
  int ntjump;
  int nsjump;
  int nljump;
  int newns;
  int newnp;
  double maxdt;
  double maxds;
  double dStack_c0;
  int ildeg;
  double maxt;
  double maxs;
  double mint;
  double mins;
  double dift;
  double difs;
  int local_88;
  int nt;
  int nl;
  int ni;
  int j;
  int i__;
  double d__1;
  int i__2;
  int i__1;
  int work_offset;
  int work_dim1;
  int *itdeg_local;
  int *isdeg_local;
  int *ns_local;
  int *np_local;
  int *n_local;
  double *y_local;
  
  local_f4[1] = 0;
  local_f4[0] = 1;
  n_local = (int *)(y + -1);
  i__1 = *n + *np * 2;
  iVar1 = i__1 + 1;
  maxds._4_4_ = *itdeg;
  i__2 = iVar1;
  _work_offset = itdeg;
  itdeg_local = isdeg;
  isdeg_local = ns;
  ns_local = np;
  np_local = n;
  nsjump = imax(3,*ns);
  if (nsjump % 2 == 0) {
    nsjump = nsjump + 1;
  }
  nljump = imax(2,*ns_local);
  difs._4_4_ = (int)(((double)nljump * 1.5) / (1.0 - 1.5 / (double)nsjump) + 0.5);
  difs._4_4_ = imax(3,difs._4_4_);
  if (difs._4_4_ % 2 == 0) {
    difs._4_4_ = difs._4_4_ + 1;
  }
  local_88 = nljump;
  if (nljump % 2 == 0) {
    local_88 = nljump + 1;
  }
  if (*robust == 0) {
    nt = 2;
  }
  else {
    nt = 1;
  }
  d__1._4_4_ = 1;
  d__1._0_4_ = (int)((double)nsjump / 10.0 + 0.9);
  c_false = imax(1,d__1._0_4_);
  d__1._4_4_ = 1;
  d__1._0_4_ = (int)((double)difs._4_4_ / 10.0 + 0.9);
  c_true = imax(1,d__1._0_4_);
  d__1._4_4_ = 1;
  d__1._0_4_ = (int)((double)local_88 / 10.0 + 0.9);
  ntjump = imax(1,d__1._0_4_);
  d__1._4_4_ = *np_local;
  for (ni = 1; ni <= d__1._4_4_; ni = ni + 1) {
    trend[(long)ni + -1] = 0.0;
  }
  stlstp_((double *)(n_local + 2),np_local,&nljump,&nsjump,(int *)((long)&difs + 4),&local_88,
          itdeg_local,_work_offset,(int *)((long)&maxds + 4),&c_false,&c_true,&ntjump,&nt,
          local_f4 + 1,rw,season,trend,work + ((long)i__2 - (long)iVar1));
  *no = 0;
  if (*robust == 0) {
    iVar1 = *np_local;
    for (ni = 1; ni <= iVar1; ni = ni + 1) {
      rw[(long)ni + -1] = 1.0;
    }
  }
  else {
    for (nl = 1; nl < 0x10; nl = nl + 1) {
      d__1._4_4_ = *np_local;
      for (ni = 1; ni <= d__1._4_4_; ni = ni + 1) {
        work[(long)(ni + i__1 * 6) - (long)iVar1] = season[(long)ni + -1];
        work[(long)(ni + i__1 * 7) - (long)iVar1] = trend[(long)ni + -1];
        work[(long)(ni + i__1) - (long)iVar1] = trend[(long)ni + -1] + season[(long)ni + -1];
      }
      stlrwt_((double *)(n_local + 2),np_local,work + ((long)(i__1 + 1) - (long)iVar1),rw);
      stlstp_((double *)(n_local + 2),np_local,&nljump,&nsjump,(int *)((long)&difs + 4),&local_88,
              itdeg_local,_work_offset,(int *)((long)&maxds + 4),&c_false,&c_true,&ntjump,&nt,
              local_f4,rw,season,trend,work + ((long)i__2 - (long)iVar1));
      *no = *no + 1;
      maxt = work[(long)(i__1 * 6 + 1) - (long)iVar1];
      mint = work[(long)(i__1 * 6 + 1) - (long)iVar1];
      dStack_c0 = work[(long)(i__1 * 7 + 1) - (long)iVar1];
      maxs = work[(long)(i__1 * 7 + 1) - (long)iVar1];
      maxdt = ABS(work[(long)(i__1 * 6 + 1) - (long)iVar1] - *season);
      _j = work[(long)(i__1 * 7 + 1) - (long)iVar1] - *trend;
      _newns = ABS(_j);
      for (ni = 2; ni <= *np_local; ni = ni + 1) {
        if (maxt < work[(long)(ni + i__1 * 6) - (long)iVar1]) {
          maxt = work[(long)(ni + i__1 * 6) - (long)iVar1];
        }
        if (dStack_c0 < work[(long)(ni + i__1 * 7) - (long)iVar1]) {
          dStack_c0 = work[(long)(ni + i__1 * 7) - (long)iVar1];
        }
        if (work[(long)(ni + i__1 * 6) - (long)iVar1] <= mint &&
            mint != work[(long)(ni + i__1 * 6) - (long)iVar1]) {
          mint = work[(long)(ni + i__1 * 6) - (long)iVar1];
        }
        if (work[(long)(ni + i__1 * 7) - (long)iVar1] <= maxs &&
            maxs != work[(long)(ni + i__1 * 7) - (long)iVar1]) {
          maxs = work[(long)(ni + i__1 * 7) - (long)iVar1];
        }
        dift = ABS(work[(long)(ni + i__1 * 6) - (long)iVar1] - season[(long)ni + -1]);
        _j = work[(long)(ni + i__1 * 7) - (long)iVar1] - trend[(long)ni + -1];
        mins = ABS(_j);
        if (maxdt < dift) {
          maxdt = dift;
        }
        if (_newns < mins) {
          _newns = mins;
        }
      }
      if ((maxdt / (maxt - mint) < 0.01) && (_newns / (dStack_c0 - maxs) < 0.01)) {
        return;
      }
    }
  }
  return;
}

Assistant:

void stlez_(double *y, int *n, int *np, int *ns, int *isdeg, int *itdeg,int *robust, int *no, 
	double *rw, double *season, double *trend, double *work)
{
    /* System generated locals */
    int work_dim1, work_offset, i__1, i__2;
    double d__1;

    /* Local variables */
    int i__, j, ni, nl, nt;
    double difs, dift, mins, mint, maxs, maxt;
    int ildeg;
    double maxds, maxdt;
    int newnp, newns, nljump, nsjump, ntjump;
	int c_false = 0;
	int c_true = 1;

		// Robust

/* Arg */
/* Var */
    /* Parameter adjustments */
    --trend;
    --season;
    --rw;
    --y;
    work_dim1 = *n + 2 * *np;
    work_offset = 1 + work_dim1;
    work -= work_offset;

    /* Function Body */
    ildeg = *itdeg;
    newns = imax(3,*ns);
    if (newns % 2 == 0) {
	++newns;
    }
    newnp = imax(2,*np);
    nt = newnp * 1.5 / (1 - 1.5 / newns) + .5;
    nt = imax(3,nt);
    if (nt % 2 == 0) {
	++nt;
    }
    nl = newnp;
    if (nl % 2 == 0) {
	++nl;
    }
    if (*robust) {
	ni = 1;
    } else {
	ni = 2;
    }
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) newns / 10 + .9);
    nsjump = imax(i__1,i__2);
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) nt / 10 + .9);
    ntjump = imax(i__1,i__2);
/* Computing MAX */
    i__1 = 1, i__2 = (int) ((double) nl / 10 + .9);
    nljump = imax(i__1,i__2);
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	trend[i__] = 0.0;
/* L2: */
    }
    stlstp_(&y[1], n, &newnp, &newns, &nt, &nl, isdeg, itdeg, &ildeg, &nsjump,
	     &ntjump, &nljump, &ni, &c_false, &rw[1], &season[1], &trend[1], &
	    work[work_offset]);
    *no = 0;
    if (*robust) {
	j = 1;
/*        Loop  --- 15 robustness iterations */
L100:
	if (j <= 15) {
	    i__1 = *n;
	    for (i__ = 1; i__ <= i__1; ++i__) {
		work[i__ + work_dim1 * 6] = season[i__];
		work[i__ + work_dim1 * 7] = trend[i__];
		work[i__ + work_dim1] = trend[i__] + season[i__];
/* L35: */
	    }
	    stlrwt_(&y[1], n, &work[work_dim1 + 1], &rw[1]);
	    stlstp_(&y[1], n, &newnp, &newns, &nt, &nl, isdeg, itdeg, &ildeg, 
		    &nsjump, &ntjump, &nljump, &ni, &c_true, &rw[1], &season[
		    1], &trend[1], &work[work_offset]);
	    ++(*no);
	    maxs = work[work_dim1 * 6 + 1];
	    mins = work[work_dim1 * 6 + 1];
	    maxt = work[work_dim1 * 7 + 1];
	    mint = work[work_dim1 * 7 + 1];
	    maxds = (d__1 = work[work_dim1 * 6 + 1] - season[1], fabs(d__1));
	    maxdt = (d__1 = work[work_dim1 * 7 + 1] - trend[1], fabs(d__1));
	    i__1 = *n;
	    for (i__ = 2; i__ <= i__1; ++i__) {
		if (maxs < work[i__ + work_dim1 * 6]) {
		    maxs = work[i__ + work_dim1 * 6];
		}
		if (maxt < work[i__ + work_dim1 * 7]) {
		    maxt = work[i__ + work_dim1 * 7];
		}
		if (mins > work[i__ + work_dim1 * 6]) {
		    mins = work[i__ + work_dim1 * 6];
		}
		if (mint > work[i__ + work_dim1 * 7]) {
		    mint = work[i__ + work_dim1 * 7];
		}
		difs = (d__1 = work[i__ + work_dim1 * 6] - season[i__], fabs(
			d__1));
		dift = (d__1 = work[i__ + work_dim1 * 7] - trend[i__], fabs(
			d__1));
		if (maxds < difs) {
		    maxds = difs;
		}
		if (maxdt < dift) {
		    maxdt = dift;
		}
/* L137: */
	    }
	    if (maxds / (maxs - mins) < .01 && maxdt / (maxt - mint) < .01) 
		    {
		goto L300;
	    }
/* L151: */
	    ++j;
	    goto L100;
	}
/*        end Loop */
L300:
	;
    } else {
/*     	.not. robust */
	i__1 = *n;
	for (i__ = 1; i__ <= i__1; ++i__) {
	    rw[i__] = 1.0;
/* L150: */
	}
    }
}